

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

void __thiscall n_e_s::core::Ppu::write_byte(Ppu *this,uint16_t addr,uint8_t byte)

{
  PpuVram *pPVar1;
  byte bVar2;
  PpuRegisters *pPVar3;
  short sVar4;
  undefined6 in_register_00000032;
  
  switch((int)CONCAT62(in_register_00000032,addr)) {
  case 0x2000:
    if ((((char)byte < '\0') && (-1 < (char)(this->registers_->ctrl).value_)) &&
       ((char)(this->registers_->status).value_ < '\0')) {
      if ((this->on_nmi_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->on_nmi_)._M_invoker)((_Any_data *)&this->on_nmi_);
    }
    (this->registers_->ctrl).value_ = byte;
    (this->registers_->temp_vram_addr).super_Register<unsigned_short>.value_ =
         (ushort)(byte & 3) << 10 |
         (this->registers_->temp_vram_addr).super_Register<unsigned_short>.value_ & 0xf3ff;
    break;
  case 0x2001:
    (this->registers_->mask).super_Register<unsigned_char>.value_ = byte;
    break;
  default:
    (*this->mmu_->_vptr_IMmu[4])(this->mmu_,(ulong)addr,(ulong)byte);
    return;
  case 0x2003:
    this->registers_->oamaddr = byte;
    break;
  case 0x2004:
    pPVar3 = this->registers_;
    if ((((pPVar3->mask).super_Register<unsigned_char>.value_ & 0x18) == 0) ||
       (0xef < pPVar3->scanline && pPVar3->scanline != 0x105)) {
      bVar2 = pPVar3->oamaddr;
      pPVar3->oamaddr = bVar2 + 1;
      this->oam_data_[bVar2] = byte;
    }
    break;
  case 0x2005:
    pPVar3 = this->registers_;
    if (pPVar3->write_toggle != true) {
      (pPVar3->temp_vram_addr).super_Register<unsigned_short>.value_ =
           (ushort)(byte >> 3) |
           (pPVar3->temp_vram_addr).super_Register<unsigned_short>.value_ & 0xffe0;
      pPVar3->fine_x_scroll = byte & 7;
LAB_0011793d:
      pPVar3->write_toggle = true;
      return;
    }
    (pPVar3->temp_vram_addr).super_Register<unsigned_short>.value_ =
         (ushort)(byte >> 3) << 5 |
         (ushort)(byte & 7) << 0xc |
         (pPVar3->temp_vram_addr).super_Register<unsigned_short>.value_ & 0x8c1f;
    goto LAB_00117915;
  case 0x2006:
    pPVar3 = this->registers_;
    if (pPVar3->write_toggle != true) {
      *(byte *)((long)&(pPVar3->temp_vram_addr).super_Register<unsigned_short>.value_ + 1) =
           byte & 0x3f;
      pPVar3 = this->registers_;
      goto LAB_0011793d;
    }
    *(uint8_t *)&(pPVar3->temp_vram_addr).super_Register<unsigned_short>.value_ = byte;
    (this->registers_->vram_addr).super_Register<unsigned_short>.value_ =
         (this->registers_->temp_vram_addr).super_Register<unsigned_short>.value_;
    pPVar3 = this->registers_;
LAB_00117915:
    pPVar3->write_toggle = false;
    break;
  case 0x2007:
    (*this->mmu_->_vptr_IMmu[4])
              (this->mmu_,(ulong)(this->registers_->vram_addr).super_Register<unsigned_short>.value_
               ,(ulong)byte);
    sVar4 = 0x20;
    if (((this->registers_->ctrl).value_ & 4) == 0) {
      sVar4 = 1;
    }
    pPVar1 = &this->registers_->vram_addr;
    (pPVar1->super_Register<unsigned_short>).value_ =
         (pPVar1->super_Register<unsigned_short>).value_ + sVar4;
  }
  return;
}

Assistant:

void Ppu::write_byte(uint16_t addr, uint8_t byte) {
    if (addr == kPpuCtrl) {
        const auto new_ctrl = PpuCtrl(byte);
        // Trigger nmi if the nmi-enabled flag goes from 0 to 1 during vblank.
        if (!registers_->ctrl.is_set(7u) && new_ctrl.is_set(7u) &&
                registers_->status.is_set(7u)) {
            on_nmi_();
        }

        registers_->ctrl = new_ctrl;
        registers_->temp_vram_addr.set_nametable(byte);
    } else if (addr == kPpuMask) {
        registers_->mask = PpuMask(byte);
    } else if (addr == kOamAddr) {
        registers_->oamaddr = byte;
    } else if (addr == kOamData) {
        if (!is_rendering_active()) {
            oam_data_[registers_->oamaddr++] = byte;
        }
    } else if (addr == kPpuScroll) {
        if (registers_->write_toggle) { // Second write, Y scroll
            const uint16_t y_scroll = (byte >> 3u);
            const auto fine_y_scroll = static_cast<uint16_t>(byte & 7u);
            registers_->temp_vram_addr.set_fine_scroll_y(fine_y_scroll);
            registers_->temp_vram_addr.set_coarse_scroll_y(y_scroll);
            registers_->write_toggle = false;
        } else { // First write, X Scroll
            const uint16_t x_scroll = (byte >> 3u);
            registers_->temp_vram_addr.set_coarse_scroll_x(x_scroll);
            registers_->fine_x_scroll = static_cast<uint8_t>(byte & 7u);
            registers_->write_toggle = true;
        }
    } else if (addr == kPpuAddr) {
        if (registers_->write_toggle) { // Second write, lower address byte
            registers_->temp_vram_addr = PpuVram(
                    (registers_->temp_vram_addr.value() & 0xFF00u) | byte);
            registers_->vram_addr = registers_->temp_vram_addr;
            registers_->write_toggle = false;
        } else { // First write, upper address byte
            // Valid addresses are $0000-$3FFF; higher addresses will be
            // mirrored down.
            const uint16_t upper_byte = (byte & 0x3Fu) << 8u;
            const uint16_t lower_byte =
                    registers_->temp_vram_addr.value() & 0x00FFu;
            registers_->temp_vram_addr = PpuVram(upper_byte | lower_byte);
            registers_->write_toggle = true;
        }
    } else if (addr == kPpuData) {
        mmu_->write_byte(registers_->vram_addr.value(), byte);
        increment_vram_address();
    } else {
        mmu_->write_byte(addr, byte);
    }
}